

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  thread thd;
  bool stop;
  dummy d;
  rpc_server server;
  function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffff918;
  rpc_server *in_stack_fffffffffffff920;
  rpc_server *this;
  string *in_stack_fffffffffffff928;
  allocator *name;
  rpc_server *in_stack_fffffffffffff930;
  rpc_server *this_00;
  type *__f;
  allocator *this_01;
  descriptor_state *local_628;
  allocator local_619;
  string local_618 [32];
  descriptor_state *local_5f8;
  allocator<char> local_5e9;
  string local_5e8 [24];
  object_fns *in_stack_fffffffffffffa30;
  void *in_stack_fffffffffffffa38;
  target_fns *in_stack_fffffffffffffa40;
  unsigned_short in_stack_fffffffffffffa4e;
  rpc_server *in_stack_fffffffffffffa50;
  allocator local_599;
  string local_598 [39];
  undefined1 local_571 [40];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [32];
  code *local_410;
  __node_base local_408;
  allocator local_3e9;
  string local_3e8 [40];
  descriptor_state local_3c0 [5];
  
  std::thread::hardware_concurrency();
  rest_rpc::rpc_service::rpc_server::rpc_server
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,(size_t)in_stack_fffffffffffffa40,
             (size_t)in_stack_fffffffffffffa38,(size_t)in_stack_fffffffffffffa30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"add",&local_3e9);
  local_410 = dummy::add;
  local_408._M_nxt = (_Hash_node_base *)0x0;
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,int(dummy::*)(std::weak_ptr<rest_rpc::rpc_service::connection>,int,int),dummy>
            (in_stack_fffffffffffff930,in_stack_fffffffffffff928,
             (offset_in_dummy_to_subr *)in_stack_fffffffffffff920,(dummy *)in_stack_fffffffffffff918
            );
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"get_dummy",&local_431);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,dummy1(std::weak_ptr<rest_rpc::rpc_service::connection>,dummy1)>
            (in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
             (_func_dummy1_weak_ptr<rest_rpc::rpc_service::connection>_dummy1 *)0x1bcc1f);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"translate",&local_459);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,std::__cxx11::string(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)0x1bcc84);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"hello",&local_481);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,void(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
             (_func_void_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)0x1bcce9);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a8,"get_person_name",&local_4a9);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,std::__cxx11::string(std::weak_ptr<rest_rpc::rpc_service::connection>,person_const&)>
            (in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_weak_ptr<rest_rpc::rpc_service::connection>_person_ptr
              *)0x1bcd4e);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"get_person",&local_4d1);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,person(std::weak_ptr<rest_rpc::rpc_service::connection>)>
            (in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
             (_func_person_weak_ptr<rest_rpc::rpc_service::connection> *)0x1bcdb3);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"upload",&local_4f9);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,void(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&,std::__cxx11::string_const&)>
            (in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
             (_func_void_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)0x1bce18);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"download",&local_521);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,std::__cxx11::string(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)0x1bce7d);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  this_01 = &local_549;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"get_name",this_01);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,std::__cxx11::string(std::weak_ptr<rest_rpc::rpc_service::connection>,person_const&)>
            (in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_weak_ptr<rest_rpc::rpc_service::connection>_person_ptr
              *)0x1bcee2);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  __f = (type *)local_571;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_571 + 1),"delay_echo",(allocator *)__f);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,void(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
             (_func_void_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)0x1bcf47);
  std::__cxx11::string::~string((string *)(local_571 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"echo",&local_599);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,std::__cxx11::string(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)0x1bcfac);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffa40,"get_int",(allocator *)&stack0xfffffffffffffa3f);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,int(std::weak_ptr<rest_rpc::rpc_service::connection>,int)>
            (in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
             (_func_int_weak_ptr<rest_rpc::rpc_service::connection>_int *)0x1bd011);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffa40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffa3f);
  this_00 = (rpc_server *)&local_5e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e8,"publish_by_token",(allocator *)this_00);
  local_5f8 = local_3c0;
  rest_rpc::rpc_service::rpc_server::register_handler<false,main::__1>
            (this_00,in_stack_fffffffffffff928,
             (anon_class_8_1_6b262081_for_f *)in_stack_fffffffffffff920);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  name = &local_619;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"publish",name);
  local_628 = local_3c0;
  rest_rpc::rpc_service::rpc_server::register_handler<false,main::__2>
            (this_00,(string *)name,(anon_class_8_1_6b262081_for_f *)in_stack_fffffffffffff920);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  this = (rpc_server *)&stack0xfffffffffffff9b8;
  std::function<void(std::shared_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string)>::
  function<main::__0,void>
            ((function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)this_00,(anon_class_1_0_00000001 *)name);
  rest_rpc::rpc_service::rpc_server::set_network_err_callback(this,in_stack_fffffffffffff918);
  std::
  function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x1bd144);
  std::thread::thread<main::__3,,void>((thread *)this_01,__f);
  rest_rpc::rpc_service::rpc_server::run((rpc_server *)0x1bd190);
  std::thread::join();
  std::thread::~thread((thread *)0x1bd1b6);
  rest_rpc::rpc_service::rpc_server::~rpc_server(this);
  return 0;
}

Assistant:

int main() {
  //  benchmark_test();
  rpc_server server(9000, std::thread::hardware_concurrency(), 3600);

  dummy d;
  server.register_handler("add", &dummy::add, &d);

  server.register_handler("get_dummy", get_dummy);

  server.register_handler("translate", translate);
  server.register_handler("hello", hello);
  server.register_handler("get_person_name", get_person_name);
  server.register_handler("get_person", get_person);
  server.register_handler("upload", upload);
  server.register_handler("download", download);
  server.register_handler("get_name", get_name);
  server.register_handler("delay_echo", delay_echo);
  server.register_handler("echo", echo);
  server.register_handler("get_int", get_int);

  server.register_handler("publish_by_token", [&server](rpc_conn conn,
                                                        std::string key,
                                                        std::string token,
                                                        std::string val) {
    server.publish_by_token(std::move(key), std::move(token), std::move(val));
  });

  server.register_handler("publish",
                          [&server](rpc_conn conn, std::string key,
                                    std::string token, std::string val) {
                            server.publish(std::move(key), std::move(val));
                          });
  server.set_network_err_callback(
      [](std::shared_ptr<connection> conn, std::string reason) {
        std::cout << "remote client address: " << conn->remote_address()
                  << " networking error, reason: " << reason << "\n";
      });

  bool stop = false;
  std::thread thd([&server, &stop] {
    person p{1, "tom", 20};
    while (!stop) {
      server.publish("key", "hello subscriber");
      auto list = server.get_token_list();
      for (auto &token : list) {
        server.publish_by_token("key", token, p);
        server.publish_by_token("key1", token, "hello subscriber1");
      }
      std::this_thread::sleep_for(std::chrono::milliseconds(50));
    }
  });

  server.run();
  stop = true;
  thd.join();
}